

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O3

void __thiscall
cmOSXBundleGenerator::CreateFramework
          (cmOSXBundleGenerator *this,string *targetName,string *outpath,string *config,
          SkipParts *skipParts)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  pointer pcVar4;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_Var5;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar6;
  cmOSXBundleGenerator *pcVar7;
  bool bVar8;
  undefined8 *puVar9;
  iterator iVar10;
  char *pcVar11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_06;
  string newName;
  string oldName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string name;
  string contentdir;
  string frameworkVersion;
  string newoutpath;
  string versions;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  undefined1 local_170 [32];
  char *local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  undefined8 local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  cmOSXBundleGenerator *local_130;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_98;
  string *local_68;
  SkipParts *local_60;
  string *local_58;
  string local_50;
  
  bVar8 = cmGeneratorTarget::HaveWellDefinedOutputFiles(this->GT);
  if (!bVar8) {
    return;
  }
  local_68 = config;
  local_60 = skipParts;
  local_58 = targetName;
  if (this->MacContentFolders ==
      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    __assert_fail("this->MacContentFolders",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmOSXBundleGenerator.cxx"
                  ,0x42,
                  "void cmOSXBundleGenerator::CreateFramework(const std::string &, const std::string &, const std::string &, const cmOSXBundleGenerator::SkipParts &)"
                 );
  }
  pcVar3 = (outpath->_M_dataplus)._M_p;
  pcVar4 = (pointer)outpath->_M_string_length;
  local_c8._M_string_length = (size_type)&local_c8.field_2;
  local_c8._M_dataplus._M_p = (char *)0x1;
  local_c8.field_2._M_local_buf[0] = '/';
  local_130 = this;
  cmGeneratorTarget::GetFrameworkDirectory(&local_108,this->GT,config,ContentLevel);
  local_170._16_8_ = local_c8._M_dataplus._M_p;
  local_170._24_8_ = local_c8._M_string_length;
  local_150 = (char *)local_108._M_string_length;
  local_148 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p;
  paVar2 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)0x1;
  local_98.field_2._M_local_buf[0] = 0x2f;
  local_140 = 1;
  views._M_len = 4;
  views._M_array = (iterator)local_170;
  local_170._0_8_ = pcVar4;
  local_170._8_8_ = pcVar3;
  local_138 = paVar2;
  local_98._M_string_length = (size_type)paVar2;
  cmCatViews_abi_cxx11_(&local_e8,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = local_170 + 0x10;
  pcVar4 = (outpath->_M_dataplus)._M_p;
  local_170._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_170,pcVar4,pcVar4 + outpath->_M_string_length);
  std::__cxx11::string::append(local_170);
  pcVar7 = local_130;
  cmGeneratorTarget::GetFrameworkDirectory(&local_c8,local_130->GT,local_68,FullLevel);
  pcVar11 = (char *)0xf;
  if ((pointer)local_170._0_8_ != pcVar3) {
    pcVar11 = (char *)local_170._16_8_;
  }
  if (pcVar11 < (char *)(local_c8._M_string_length + local_170._8_8_)) {
    pcVar11 = (char *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      pcVar11 = (char *)CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                 local_c8.field_2._M_local_buf[0]);
    }
    if ((char *)(local_c8._M_string_length + local_170._8_8_) <= pcVar11) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,local_170._0_8_);
      goto LAB_004ab212;
    }
  }
  puVar9 = (undefined8 *)std::__cxx11::string::_M_append(local_170,(ulong)local_c8._M_dataplus._M_p)
  ;
LAB_004ab212:
  psVar1 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_98.field_2._M_allocated_capacity = *psVar1;
    local_98.field_2._8_8_ = puVar9[3];
    local_98._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar1;
    local_98._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_98._M_string_length = puVar9[1];
  *puVar9 = psVar1;
  puVar9[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  if ((pointer)local_170._0_8_ != pcVar3) {
    operator_delete((void *)local_170._0_8_,(ulong)(local_170._16_8_ + 1));
  }
  cmGeneratorTarget::GetFrameworkVersion_abi_cxx11_(&local_c8,pcVar7->GT);
  cmsys::SystemTools::GetFilenameName(&local_108,local_58);
  if (local_60->infoPlist == false) {
    local_170._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_170,local_98._M_dataplus._M_p,
               local_98._M_dataplus._M_p + local_98._M_string_length);
    bVar8 = cmMakefile::PlatformIsAppleEmbedded(pcVar7->Makefile);
    if (!bVar8) {
      this_00 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 *)pcVar7->MacContentFolders;
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"Resources","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>(this_00,&local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,
                        CONCAT71(local_190.field_2._M_allocated_capacity._1_7_,
                                 local_190.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::string::append(local_170);
    }
    std::__cxx11::string::append(local_170);
    cmLocalGenerator::GenerateFrameworkInfoPList
              (pcVar7->LocalGenerator,pcVar7->GT,&local_108,(string *)local_170);
    if ((pointer)local_170._0_8_ != pcVar3) {
      operator_delete((void *)local_170._0_8_,(ulong)(local_170._16_8_ + 1));
    }
  }
  bVar8 = cmMakefile::PlatformIsAppleEmbedded(pcVar7->Makefile);
  if (!bVar8) {
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    local_190._M_string_length = 0;
    local_190.field_2._M_local_buf[0] = '\0';
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    local_1b0._M_string_length = 0;
    local_1b0.field_2._M_local_buf[0] = '\0';
    local_170._0_8_ = local_e8._M_string_length;
    local_170._8_8_ = local_e8._M_dataplus._M_p;
    local_170._16_8_ = 8;
    local_170._24_8_ = "Versions";
    views_00._M_len = 2;
    views_00._M_array = (iterator)local_170;
    cmCatViews_abi_cxx11_(&local_50,views_00);
    cmsys::SystemTools::MakeDirectory(&local_50,(mode_t *)0x0);
    cmsys::SystemTools::MakeDirectory(&local_98,(mode_t *)0x0);
    std::__cxx11::string::_M_assign((string *)&local_190);
    local_170._0_8_ = local_50._M_string_length;
    local_170._8_8_ = local_50._M_dataplus._M_p;
    local_170._16_8_ = 8;
    local_170._24_8_ = "/Current";
    views_01._M_len = 2;
    views_01._M_array = (iterator)local_170;
    cmCatViews_abi_cxx11_(&local_128,views_01);
    std::__cxx11::string::operator=((string *)&local_1b0,(string *)&local_128);
    paVar2 = &local_128.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::RemoveFile(&local_1b0);
    cmSystemTools::CreateSymlink(&local_190,&local_1b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pcVar7->Makefile->OutputFiles,&local_1b0);
    local_170._0_8_ = &DAT_00000011;
    local_170._8_8_ = "Versions/Current/";
    local_170._16_8_ = local_108._M_string_length;
    local_170._24_8_ = local_108._M_dataplus._M_p;
    views_02._M_len = 2;
    views_02._M_array = (iterator)local_170;
    cmCatViews_abi_cxx11_(&local_128,views_02);
    std::__cxx11::string::operator=((string *)&local_190,(string *)&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    local_170._0_8_ = local_e8._M_string_length;
    local_170._8_8_ = local_e8._M_dataplus._M_p;
    local_170._16_8_ = local_108._M_string_length;
    local_170._24_8_ = local_108._M_dataplus._M_p;
    views_03._M_len = 2;
    views_03._M_array = (iterator)local_170;
    cmCatViews_abi_cxx11_(&local_128,views_03);
    std::__cxx11::string::operator=((string *)&local_1b0,(string *)&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::RemoveFile(&local_1b0);
    cmSystemTools::CreateSymlink(&local_190,&local_1b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pcVar7->Makefile->OutputFiles,&local_1b0);
    p_Var5 = &pcVar7->MacContentFolders->_M_t;
    local_170._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"Resources","");
    iVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(p_Var5,(key_type *)local_170);
    psVar6 = pcVar7->MacContentFolders;
    if ((pointer)local_170._0_8_ != pcVar3) {
      operator_delete((void *)local_170._0_8_,(ulong)(local_170._16_8_ + 1));
    }
    pcVar7 = local_130;
    if ((_Rb_tree_header *)iVar10._M_node != &(psVar6->_M_t)._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_190,0,(char *)local_190._M_string_length,0x717fa1);
      local_170._0_8_ = local_e8._M_string_length;
      local_170._8_8_ = local_e8._M_dataplus._M_p;
      local_170._16_8_ = (char *)0x9;
      local_170._24_8_ = (long)"/*/Resources" + 3;
      views_04._M_len = 2;
      views_04._M_array = (iterator)local_170;
      cmCatViews_abi_cxx11_(&local_128,views_04);
      std::__cxx11::string::operator=((string *)&local_1b0,(string *)&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      cmsys::SystemTools::RemoveFile(&local_1b0);
      cmSystemTools::CreateSymlink(&local_190,&local_1b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&pcVar7->Makefile->OutputFiles,&local_1b0);
    }
    p_Var5 = &pcVar7->MacContentFolders->_M_t;
    local_170._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"Headers","");
    iVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(p_Var5,(key_type *)local_170);
    psVar6 = pcVar7->MacContentFolders;
    if ((pointer)local_170._0_8_ != pcVar3) {
      operator_delete((void *)local_170._0_8_,(ulong)(local_170._16_8_ + 1));
    }
    pcVar7 = local_130;
    if ((_Rb_tree_header *)iVar10._M_node != &(psVar6->_M_t)._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_190,0,(char *)local_190._M_string_length,0x717fbc);
      local_170._0_8_ = local_e8._M_string_length;
      local_170._8_8_ = local_e8._M_dataplus._M_p;
      local_170._16_8_ = (char *)0x7;
      local_170._24_8_ = (long)"Versions/Current/Headers" + 0x11;
      views_05._M_len = 2;
      views_05._M_array = (iterator)local_170;
      cmCatViews_abi_cxx11_(&local_128,views_05);
      std::__cxx11::string::operator=((string *)&local_1b0,(string *)&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      cmsys::SystemTools::RemoveFile(&local_1b0);
      cmSystemTools::CreateSymlink(&local_190,&local_1b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&pcVar7->Makefile->OutputFiles,&local_1b0);
    }
    p_Var5 = &pcVar7->MacContentFolders->_M_t;
    local_170._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"PrivateHeaders","");
    iVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(p_Var5,(key_type *)local_170);
    psVar6 = pcVar7->MacContentFolders;
    if ((pointer)local_170._0_8_ != pcVar3) {
      operator_delete((void *)local_170._0_8_,(ulong)(local_170._16_8_ + 1));
    }
    pcVar7 = local_130;
    if ((_Rb_tree_header *)iVar10._M_node != &(psVar6->_M_t)._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_190,0,(char *)local_190._M_string_length,0x717fd5);
      local_170._0_8_ = local_e8._M_string_length;
      local_170._8_8_ = local_e8._M_dataplus._M_p;
      local_170._16_8_ = (char *)0xe;
      local_170._24_8_ = (long)"Versions/Current/PrivateHeaders" + 0x11;
      views_06._M_len = 2;
      views_06._M_array = (iterator)local_170;
      cmCatViews_abi_cxx11_(&local_128,views_06);
      std::__cxx11::string::operator=((string *)&local_1b0,(string *)&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      cmsys::SystemTools::RemoveFile(&local_1b0);
      cmSystemTools::CreateSymlink(&local_190,&local_1b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&pcVar7->Makefile->OutputFiles,&local_1b0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,
                      CONCAT71(local_1b0.field_2._M_allocated_capacity._1_7_,
                               local_1b0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,
                      CONCAT71(local_190.field_2._M_allocated_capacity._1_7_,
                               local_190.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmOSXBundleGenerator::CreateFramework(
  const std::string& targetName, const std::string& outpath,
  const std::string& config, const cmOSXBundleGenerator::SkipParts& skipParts)
{
  if (this->MustSkip()) {
    return;
  }

  assert(this->MacContentFolders);

  // Compute the location of the top-level foo.framework directory.
  std::string contentdir = cmStrCat(
    outpath, '/',
    this->GT->GetFrameworkDirectory(config, cmGeneratorTarget::ContentLevel),
    '/');

  std::string newoutpath = outpath + "/" +
    this->GT->GetFrameworkDirectory(config, cmGeneratorTarget::FullLevel);

  std::string frameworkVersion = this->GT->GetFrameworkVersion();

  std::string name = cmSystemTools::GetFilenameName(targetName);
  if (!skipParts.infoPlist) {
    // Configure the Info.plist file
    std::string plist = newoutpath;
    if (!this->Makefile->PlatformIsAppleEmbedded()) {
      // Put the Info.plist file into the Resources directory.
      this->MacContentFolders->insert("Resources");
      plist += "/Resources";
    }
    plist += "/Info.plist";
    this->LocalGenerator->GenerateFrameworkInfoPList(this->GT, name, plist);
  }

  // Generate Versions directory only for MacOSX frameworks
  if (this->Makefile->PlatformIsAppleEmbedded()) {
    return;
  }

  // TODO: Use the cmMakefileTargetGenerator::ExtraFiles vector to
  // drive rules to create these files at build time.
  std::string oldName;
  std::string newName;

  // Make foo.framework/Versions
  std::string versions = cmStrCat(contentdir, "Versions");
  cmSystemTools::MakeDirectory(versions);

  // Make foo.framework/Versions/version
  cmSystemTools::MakeDirectory(newoutpath);

  // Current -> version
  oldName = frameworkVersion;
  newName = cmStrCat(versions, "/Current");
  cmSystemTools::RemoveFile(newName);
  cmSystemTools::CreateSymlink(oldName, newName);
  this->Makefile->AddCMakeOutputFile(newName);

  // foo -> Versions/Current/foo
  oldName = cmStrCat("Versions/Current/", name);
  newName = cmStrCat(contentdir, name);
  cmSystemTools::RemoveFile(newName);
  cmSystemTools::CreateSymlink(oldName, newName);
  this->Makefile->AddCMakeOutputFile(newName);

  // Resources -> Versions/Current/Resources
  if (this->MacContentFolders->find("Resources") !=
      this->MacContentFolders->end()) {
    oldName = "Versions/Current/Resources";
    newName = cmStrCat(contentdir, "Resources");
    cmSystemTools::RemoveFile(newName);
    cmSystemTools::CreateSymlink(oldName, newName);
    this->Makefile->AddCMakeOutputFile(newName);
  }

  // Headers -> Versions/Current/Headers
  if (this->MacContentFolders->find("Headers") !=
      this->MacContentFolders->end()) {
    oldName = "Versions/Current/Headers";
    newName = cmStrCat(contentdir, "Headers");
    cmSystemTools::RemoveFile(newName);
    cmSystemTools::CreateSymlink(oldName, newName);
    this->Makefile->AddCMakeOutputFile(newName);
  }

  // PrivateHeaders -> Versions/Current/PrivateHeaders
  if (this->MacContentFolders->find("PrivateHeaders") !=
      this->MacContentFolders->end()) {
    oldName = "Versions/Current/PrivateHeaders";
    newName = cmStrCat(contentdir, "PrivateHeaders");
    cmSystemTools::RemoveFile(newName);
    cmSystemTools::CreateSymlink(oldName, newName);
    this->Makefile->AddCMakeOutputFile(newName);
  }
}